

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O3

int decode_new_symbol(byte_t *input_buffer)

{
  uint uVar1;
  ulong in_RAX;
  adh_node_t *node;
  byte_t new_symbol [1];
  undefined8 uStack_8;
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  uVar1 = read_data_cross_bytes(input_buffer,8,(byte_t *)((long)&uStack_8 + 7));
  if ((int)uVar1 < 2) {
    output_buffer[output_byte_idx] = uStack_8._7_1_;
    output_byte_idx = output_byte_idx + 1;
    node = adh_create_node_and_append((ushort)uStack_8._7_1_);
    adh_update_tree(node,true);
  }
  else {
    log_error("decode_new_symbol","expected 1 byte received %d bytes",(ulong)uVar1);
  }
  return (uint)((int)uVar1 >= 2);
}

Assistant:

int decode_new_symbol(const byte_t input_buffer[]) {
#ifdef _DEBUG
    log_debug("decode_new_symbol", "in_bit_idx=%-8u\n", in_bit_idx);
#endif

    byte_t  new_symbol[1] = {0};
    int     num_bytes = read_data_cross_bytes(input_buffer, SYMBOL_BITS, new_symbol);
    if(num_bytes > 1) {
        log_error("decode_new_symbol", "expected 1 byte received %d bytes", num_bytes);
        return RC_FAIL;
    }

    output_symbol(new_symbol[0]);
    adh_node_t * node = adh_create_node_and_append(new_symbol[0]);
    adh_update_tree(node, true);
    return RC_OK;
}